

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pcache1Pagecount(sqlite3_pcache *p)

{
  int iVar1;
  
  if ((sqlite3_mutex *)**(undefined8 **)p != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)**(undefined8 **)p);
  }
  iVar1 = *(int *)(p + 0x28);
  if ((sqlite3_mutex *)**(undefined8 **)p != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)**(undefined8 **)p);
  }
  return iVar1;
}

Assistant:

static int pcache1Pagecount(sqlite3_pcache *p){
  int n;
  PCache1 *pCache = (PCache1*)p;
  pcache1EnterMutex(pCache->pGroup);
  n = pCache->nPage;
  pcache1LeaveMutex(pCache->pGroup);
  return n;
}